

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix4f.cpp
# Opt level: O0

Matrix4f * Matrix4f::scaling(Matrix4f *__return_storage_ptr__,float sx,float sy,float sz)

{
  float sz_local;
  float sy_local;
  float sx_local;
  
  Matrix4f(__return_storage_ptr__,sx,0.0,0.0,0.0,0.0,sy,0.0,0.0,0.0,0.0,sz,0.0,0.0,0.0,0.0,1.0);
  return __return_storage_ptr__;
}

Assistant:

Matrix4f Matrix4f::scaling( float sx, float sy, float sz )
{
	return Matrix4f
	(
		sx, 0, 0, 0,
		0, sy, 0, 0,
		0, 0, sz, 0,
		0, 0, 0, 1
	);
}